

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
passthrough_resampler<float>::fill
          (passthrough_resampler<float> *this,void *input_buffer,long *input_frames_count,
          void *output_buffer,long output_frames)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  long in_RCX;
  size_t *in_RDX;
  float *in_RSI;
  long in_RDI;
  size_t in_R8;
  long rv;
  unsigned_long samples_off;
  unsigned_long pop_input_count;
  void *in_buf;
  size_t in_stack_ffffffffffffff78;
  auto_array<float> *in_stack_ffffffffffffff80;
  auto_array<float> *in_stack_ffffffffffffff88;
  passthrough_resampler<float> *in_stack_ffffffffffffff90;
  size_t local_38;
  float *local_30;
  size_t local_28;
  
  local_38 = 0;
  local_30 = in_RSI;
  if ((in_RSI == (float *)0x0) || (in_RCX != 0)) {
    local_28 = in_R8;
    if (in_RSI != (float *)0x0) {
      sVar3 = auto_array<float>::length((auto_array<float> *)(in_RDI + 0x28));
      if ((sVar3 == 0) && ((long)in_R8 <= (long)*in_RDX)) {
        if ((long)in_R8 < (long)*in_RDX) {
          sVar3 = processor::frames_to_samples((processor *)(in_RDI + 8),in_R8);
          in_stack_ffffffffffffff78 = in_RDI + 0x28;
          in_stack_ffffffffffffff80 = (auto_array<float> *)(in_RSI + sVar3);
          processor::frames_to_samples((processor *)(in_RDI + 8),*in_RDX - in_R8);
          auto_array<float>::push
                    ((auto_array<float> *)in_stack_ffffffffffffff90,
                     (float *)in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
        }
      }
      else {
        processor::frames_to_samples((processor *)(in_RDI + 8),*in_RDX);
        auto_array<float>::push
                  ((auto_array<float> *)in_stack_ffffffffffffff90,(float *)in_stack_ffffffffffffff88
                   ,(size_t)in_stack_ffffffffffffff80);
        sVar3 = auto_array<float>::length((auto_array<float> *)(in_RDI + 0x28));
        sVar1 = processor::frames_to_samples((processor *)(in_RDI + 8),in_R8);
        if (sVar3 < sVar1) {
          local_38 = auto_array<float>::length((auto_array<float> *)(in_RDI + 0x28));
          in_stack_ffffffffffffff90 = (passthrough_resampler<float> *)(in_RDI + 0x28);
          in_stack_ffffffffffffff88 =
               (auto_array<float> *)processor::frames_to_samples((processor *)(in_RDI + 8),in_R8);
          auto_array<float>::length((auto_array<float> *)(in_RDI + 0x28));
          auto_array<float>::push_silence(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
        else {
          local_38 = processor::frames_to_samples((processor *)(in_RDI + 8),in_R8);
        }
        local_30 = auto_array<float>::data((auto_array<float> *)(in_RDI + 0x28));
      }
    }
  }
  else {
    local_28 = *in_RDX;
  }
  lVar2 = (**(code **)(in_RDI + 0x18))
                    (*(undefined8 *)(in_RDI + 0x10),*(undefined8 *)(in_RDI + 0x20),local_30,in_RCX,
                     local_28);
  if (in_RSI != (float *)0x0) {
    if (local_38 == 0) {
      *in_RDX = local_28;
    }
    else {
      auto_array<float>::pop
                (in_stack_ffffffffffffff88,(float *)in_stack_ffffffffffffff80,
                 in_stack_ffffffffffffff78);
      sVar3 = processor::samples_to_frames((processor *)(in_RDI + 8),local_38);
      *in_RDX = sVar3;
    }
    drop_audio_if_needed(in_stack_ffffffffffffff90);
  }
  return lVar2;
}

Assistant:

long
passthrough_resampler<T>::fill(void * input_buffer, long * input_frames_count,
                               void * output_buffer, long output_frames)
{
  if (input_buffer) {
    assert(input_frames_count);
  }
  assert((input_buffer && output_buffer) ||
         (output_buffer && !input_buffer &&
          (!input_frames_count || *input_frames_count == 0)) ||
         (input_buffer && !output_buffer && output_frames == 0));

  // When we have no pending input data and exactly as much input
  // as output data, we don't need to copy it into the internal buffer
  // and can directly forward it to the callback.
  void * in_buf = input_buffer;
  unsigned long pop_input_count = 0u;
  if (input_buffer && !output_buffer) {
    output_frames = *input_frames_count;
  } else if (input_buffer) {
    if (internal_input_buffer.length() != 0 ||
        *input_frames_count < output_frames) {
      // If we have pending input data left and have to first append the input
      // so we can pass it as one pointer to the callback. Or this is a glitch.
      // It can happen when system's performance is poor. Audible silence is
      // being pushed at the end of the short input buffer. An improvement for
      // the future is to resample to the output number of frames, when that
      // happens.
      internal_input_buffer.push(static_cast<T *>(input_buffer),
                                 frames_to_samples(*input_frames_count));
      if (internal_input_buffer.length() < frames_to_samples(output_frames)) {
        // This is unxpected but it can happen when a glitch occurs. Fill the
        // buffer with silence. First keep the actual number of input samples
        // used without the silence.
        pop_input_count = internal_input_buffer.length();
        internal_input_buffer.push_silence(frames_to_samples(output_frames) -
                                           internal_input_buffer.length());
      } else {
        pop_input_count = frames_to_samples(output_frames);
      }
      in_buf = internal_input_buffer.data();
    } else if (*input_frames_count > output_frames) {
      // In this case we have more input that we need output and
      // fill the overflowing input into internal_input_buffer
      // Since we have no other pending data, we can nonetheless
      // pass the current input data directly to the callback
      assert(pop_input_count == 0);
      unsigned long samples_off = frames_to_samples(output_frames);
      internal_input_buffer.push(
          static_cast<T *>(input_buffer) + samples_off,
          frames_to_samples(*input_frames_count - output_frames));
    }
  }

  long rv =
      data_callback(stream, user_ptr, in_buf, output_buffer, output_frames);

  if (input_buffer) {
    if (pop_input_count) {
      internal_input_buffer.pop(nullptr, pop_input_count);
      *input_frames_count = samples_to_frames(pop_input_count);
    } else {
      *input_frames_count = output_frames;
    }
    drop_audio_if_needed();
  }

  return rv;
}